

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qwizard.cpp
# Opt level: O2

void QWizard::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  QFlagsStorage<QWizard::WizardOption> *pQVar2;
  undefined4 uVar3;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      currentIdChanged((QWizard *)_o,*_a[1]);
      return;
    case 1:
      helpRequested((QWizard *)_o);
      return;
    case 2:
      customButtonClicked((QWizard *)_o,*_a[1]);
      return;
    case 3:
      pageAdded((QWizard *)_o,*_a[1]);
      return;
    case 4:
      pageRemoved((QWizard *)_o,*_a[1]);
      return;
    case 5:
      back((QWizard *)_o);
      return;
    case 6:
      next((QWizard *)_o);
      return;
    case 7:
      pQVar2 = (QFlagsStorage<QWizard::WizardOption> *)_a[1];
switchD_004c577a_caseD_5:
      setCurrentId((QWizard *)_o,pQVar2->i);
      return;
    case 8:
      restart((QWizard *)_o);
      return;
    case 9:
      QWizardPrivate::_q_emitCustomButtonClicked(*(QWizardPrivate **)(_o + 8));
      return;
    case 10:
      QWizardPrivate::_q_updateButtonStates(*(QWizardPrivate **)(_o + 8));
      return;
    case 0xb:
      QWizardPrivate::_q_handleFieldObjectDestroyed(*(QWizardPrivate **)(_o + 8),*_a[1]);
      return;
    }
    break;
  case ReadProperty:
    if ((uint)_id < 6) {
      switch(_id) {
      case 0:
        uVar3 = *(undefined4 *)(*(long *)(_o + 8) + 900);
        break;
      case 1:
        uVar3 = *(undefined4 *)(*(long *)(_o + 8) + 0x388);
        break;
      case 2:
        uVar3 = *(undefined4 *)(*(long *)(_o + 8) + 0x3b8);
        break;
      case 3:
        uVar3 = *(undefined4 *)(*(long *)(_o + 8) + 0x3bc);
        break;
      case 4:
        uVar3 = *(undefined4 *)(*(long *)(_o + 8) + 0x338);
        break;
      case 5:
        uVar3 = *(undefined4 *)(*(long *)(_o + 8) + 0x340);
      }
      *(undefined4 *)*_a = uVar3;
    }
    break;
  case WriteProperty:
    if ((uint)_id < 6) {
      pQVar2 = (QFlagsStorage<QWizard::WizardOption> *)*_a;
      switch(_id) {
      case 0:
        setWizardStyle((QWizard *)_o,pQVar2->i);
        return;
      case 1:
        setOptions((QWizard *)_o,(WizardOptions)pQVar2->i);
        return;
      case 2:
        setTitleFormat((QWizard *)_o,pQVar2->i);
        return;
      case 3:
        setSubTitleFormat((QWizard *)_o,pQVar2->i);
        return;
      case 4:
        setStartId((QWizard *)_o,pQVar2->i);
        return;
      }
      goto switchD_004c577a_caseD_5;
    }
    break;
  case IndexOfMethod:
    bVar1 = QtMocHelpers::indexOfMethod<void(QWizard::*)(int)>
                      ((QtMocHelpers *)_a,(void **)currentIdChanged,0,0);
    if ((((!bVar1) &&
         (bVar1 = QtMocHelpers::indexOfMethod<void(QWizard::*)()>
                            ((QtMocHelpers *)_a,(void **)helpRequested,0,1), !bVar1)) &&
        (bVar1 = QtMocHelpers::indexOfMethod<void(QWizard::*)(int)>
                           ((QtMocHelpers *)_a,(void **)customButtonClicked,0,2), !bVar1)) &&
       (bVar1 = QtMocHelpers::indexOfMethod<void(QWizard::*)(int)>
                          ((QtMocHelpers *)_a,(void **)pageAdded,0,3), !bVar1)) {
      QtMocHelpers::indexOfMethod<void(QWizard::*)(int)>
                ((QtMocHelpers *)_a,(void **)pageRemoved,0,4);
      return;
    }
  }
  return;
}

Assistant:

void QWizard::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QWizard *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->currentIdChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->helpRequested(); break;
        case 2: _t->customButtonClicked((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->pageAdded((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->pageRemoved((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 5: _t->back(); break;
        case 6: _t->next(); break;
        case 7: _t->setCurrentId((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 8: _t->restart(); break;
        case 9: _t->d_func()->_q_emitCustomButtonClicked(); break;
        case 10: _t->d_func()->_q_updateButtonStates(); break;
        case 11: _t->d_func()->_q_handleFieldObjectDestroyed((*reinterpret_cast< std::add_pointer_t<QObject*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QWizard::*)(int )>(_a, &QWizard::currentIdChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWizard::*)()>(_a, &QWizard::helpRequested, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWizard::*)(int )>(_a, &QWizard::customButtonClicked, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWizard::*)(int )>(_a, &QWizard::pageAdded, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWizard::*)(int )>(_a, &QWizard::pageRemoved, 4))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<WizardStyle*>(_v) = _t->wizardStyle(); break;
        case 1: QtMocHelpers::assignFlags<WizardOptions>(_v, _t->options()); break;
        case 2: *reinterpret_cast<Qt::TextFormat*>(_v) = _t->titleFormat(); break;
        case 3: *reinterpret_cast<Qt::TextFormat*>(_v) = _t->subTitleFormat(); break;
        case 4: *reinterpret_cast<int*>(_v) = _t->startId(); break;
        case 5: *reinterpret_cast<int*>(_v) = _t->currentId(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setWizardStyle(*reinterpret_cast<WizardStyle*>(_v)); break;
        case 1: _t->setOptions(*reinterpret_cast<WizardOptions*>(_v)); break;
        case 2: _t->setTitleFormat(*reinterpret_cast<Qt::TextFormat*>(_v)); break;
        case 3: _t->setSubTitleFormat(*reinterpret_cast<Qt::TextFormat*>(_v)); break;
        case 4: _t->setStartId(*reinterpret_cast<int*>(_v)); break;
        case 5: _t->setCurrentId(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
}